

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

bool __thiscall kj::HttpHeaders::tryParse(HttpHeaders *this,ArrayPtr<char> content)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  char *ptr;
  
  uVar3 = content.size_;
  ptr = content.ptr;
  if ((1 < uVar3) && (ptr[uVar3 - 1] == '\n')) {
    lVar1 = uVar3 - 1;
    if (ptr[uVar3 - 2] == '\r') {
      lVar1 = uVar3 - 2;
    }
    ptr[~(ulong)(ptr[uVar3 - 2] == '\r') + uVar3] = '\0';
    bVar2 = parseHeaders(this,ptr,ptr + lVar1);
    return bVar2;
  }
  return false;
}

Assistant:

static char* trimHeaderEnding(kj::ArrayPtr<char> content) {
  // Trim off the trailing \r\n from a header blob.

  if (content.size() < 2) return nullptr;

  // Remove trailing \r\n\r\n and replace with \0 sentinel char.
  char* end = content.end();

  if (end[-1] != '\n') return nullptr;
  --end;
  if (end[-1] == '\r') --end;
  *end = '\0';

  return end;
}